

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ulong in_RAX;
  GLFWmonitor *handle;
  GLFWvidmode *pGVar2;
  GLFWwindow *handle_00;
  char *pcVar3;
  int height;
  char *pcVar4;
  undefined8 local_28;
  
  local_28 = in_RAX;
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
LAB_00106b72:
    exit(1);
  }
  handle = (GLFWmonitor *)0x0;
  while( true ) {
    iVar1 = getopt(argc,argv,"fh");
    if (iVar1 != 0x66) break;
    handle = glfwGetPrimaryMonitor();
  }
  if (iVar1 == -1) {
    if (handle == (GLFWmonitor *)0x0) {
      height = 0x1e0;
      iVar1 = 0x280;
    }
    else {
      pGVar2 = glfwGetVideoMode(handle);
      iVar1 = pGVar2->width;
      height = pGVar2->height;
    }
    local_28 = CONCAT44(iVar1,height);
    handle_00 = glfwCreateWindow(iVar1,height,"Iconify",handle,(GLFWwindow *)0x0);
    if (handle_00 == (GLFWwindow *)0x0) {
      glfwTerminate();
      goto LAB_00106b72;
    }
    glfwMakeContextCurrent(handle_00);
    glfwSwapInterval(1);
    glfwSetKeyCallback(handle_00,key_callback);
    glfwSetFramebufferSizeCallback(handle_00,framebuffer_size_callback);
    glfwSetWindowSizeCallback(handle_00,window_size_callback);
    glfwSetWindowFocusCallback(handle_00,window_focus_callback);
    glfwSetWindowIconifyCallback(handle_00,window_iconify_callback);
    iVar1 = glfwGetWindowAttrib(handle_00,0x20002);
    pcVar4 = "iconified";
    if (iVar1 == 0) {
      pcVar4 = "restored";
    }
    iVar1 = glfwGetWindowAttrib(handle_00,0x20001);
    pcVar3 = "focused";
    if (iVar1 == 0) {
      pcVar3 = "defocused";
    }
    printf("Window is %s and %s\n",pcVar4,pcVar3);
    glEnable(0xc11);
    while( true ) {
      iVar1 = glfwWindowShouldClose(handle_00);
      if (iVar1 != 0) break;
      glfwGetFramebufferSize(handle_00,(int *)((long)&local_28 + 4),(int *)&local_28);
      glScissor(0,0,local_28._4_4_,local_28 & 0xffffffff);
      glClearColor(0,0,0,0);
      glClear(0x4000);
      glScissor(0,0,0x280,0x1e0);
      glClearColor();
      glClear(0x4000);
      glfwSwapBuffers(handle_00);
      glfwPollEvents();
    }
    glfwTerminate();
  }
  else {
    if (iVar1 != 0x68) {
      usage();
      goto LAB_00106b72;
    }
    usage();
  }
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    int width, height, ch;
    GLFWmonitor* monitor = NULL;
    GLFWwindow* window;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    while ((ch = getopt(argc, argv, "fh")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                monitor = glfwGetPrimaryMonitor();
                break;

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    if (monitor)
    {
        const GLFWvidmode* mode = glfwGetVideoMode(monitor);
        width = mode->width;
        height = mode->height;
    }
    else
    {
        width = 640;
        height = 480;
    }

    window = glfwCreateWindow(width, height, "Iconify", monitor, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    glfwSwapInterval(1);

    glfwSetKeyCallback(window, key_callback);
    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);
    glfwSetWindowSizeCallback(window, window_size_callback);
    glfwSetWindowFocusCallback(window, window_focus_callback);
    glfwSetWindowIconifyCallback(window, window_iconify_callback);

    printf("Window is %s and %s\n",
           glfwGetWindowAttrib(window, GLFW_ICONIFIED) ? "iconified" : "restored",
           glfwGetWindowAttrib(window, GLFW_FOCUSED) ? "focused" : "defocused");

    glEnable(GL_SCISSOR_TEST);

    while (!glfwWindowShouldClose(window))
    {
        glfwGetFramebufferSize(window, &width, &height);

        glScissor(0, 0, width, height);
        glClearColor(0, 0, 0, 0);
        glClear(GL_COLOR_BUFFER_BIT);

        glScissor(0, 0, 640, 480);
        glClearColor(1, 1, 1, 0);
        glClear(GL_COLOR_BUFFER_BIT);

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}